

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UintTypes.cpp
# Opt level: O2

bool jbcoin::to_currency(Currency *currency,string *code)

{
  pointer pcVar1;
  size_type sVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  Serializer s;
  Blob codeBlob;
  
  if (code->_M_string_length != 0) {
    systemCurrencyCode_abi_cxx11_();
    iVar5 = std::__cxx11::string::compare((string *)code);
    if (iVar5 != 0) {
      if (code->_M_string_length == 0x28) {
        bVar4 = base_uint<160UL,_jbcoin::detail::CurrencyTag>::SetHex(currency,code,false);
        return bVar4;
      }
      if (code->_M_string_length == 3) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  (&codeBlob,3,(allocator_type *)&s);
        pcVar1 = (code->_M_dataplus)._M_p;
        sVar2 = code->_M_string_length;
        for (sVar6 = 0; sVar2 != sVar6; sVar6 = sVar6 + 1) {
          iVar5 = toupper((int)pcVar1[sVar6]);
          codeBlob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[sVar6] = (uchar)iVar5;
        }
        Serializer::Serializer(&s,0x100);
        Serializer::addZeros(&s,0xc);
        Serializer::addRaw(&s,&codeBlob);
        Serializer::addZeros(&s,2);
        Serializer::addZeros(&s,3);
        if (0x13 < (ulong)((long)s.mData.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)s.mData.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start)) {
          currency->pn[4] =
               *(uint32_t *)
                (s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start + 0x10);
          uVar3 = *(undefined8 *)
                   (s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8);
          *(undefined8 *)currency->pn =
               *(undefined8 *)
                s.mData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
          *(undefined8 *)(currency->pn + 2) = uVar3;
        }
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&s);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  (&codeBlob.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
        return true;
      }
      return false;
    }
  }
  currency->pn[0] = 0;
  currency->pn[1] = 0;
  currency->pn[2] = 0;
  currency->pn[3] = 0;
  currency->pn[4] = 0;
  return true;
}

Assistant:

bool to_currency(Currency& currency, std::string const& code)
{
    if (code.empty () || !code.compare (systemCurrencyCode()))
    {
        currency = zero;
        return true;
    }

    static const int CURRENCY_CODE_LENGTH = 3;
    if (code.size () == CURRENCY_CODE_LENGTH)
    {
        Blob codeBlob (CURRENCY_CODE_LENGTH);

        std::transform (code.begin (), code.end (), codeBlob.begin (), ::toupper);

        Serializer  s;

        s.addZeros (96 / 8);
        s.addRaw (codeBlob);
        s.addZeros (16 / 8);
        s.addZeros (24 / 8);

        s.get160 (currency, 0);
        return true;
    }

    if (40 == code.size ())
        return currency.SetHex (code);

    return false;
}